

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void * stbi__malloc_mad2(int a,int b,int add)

{
  int iVar1;
  int add_local;
  int b_local;
  int a_local;
  
  iVar1 = stbi__mad2sizes_valid(a,b,add);
  if (iVar1 == 0) {
    _b_local = (void *)0x0;
  }
  else {
    _b_local = stbi__malloc((long)(a * b + add));
  }
  return _b_local;
}

Assistant:

static void *stbi__malloc_mad2(int a, int b, int add)
{
   if (!stbi__mad2sizes_valid(a, b, add)) return NULL;
   return stbi__malloc(a*b + add);
}